

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5RowidMethod(sqlite3_vtab_cursor *pCursor,sqlite_int64 *pRowid)

{
  i64 iVar1;
  
  if (*(int *)&pCursor[4].pVtab == 3) {
    iVar1 = 0;
  }
  else {
    iVar1 = fts5CursorRowid((Fts5Cursor *)pCursor);
  }
  *pRowid = iVar1;
  return 0;
}

Assistant:

static int fts5RowidMethod(sqlite3_vtab_cursor *pCursor, sqlite_int64 *pRowid){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int ePlan = pCsr->ePlan;

  assert( CsrFlagTest(pCsr, FTS5CSR_EOF)==0 );
  if( ePlan==FTS5_PLAN_SPECIAL ){
    *pRowid = 0;
  }else{
    *pRowid = fts5CursorRowid(pCsr);
  }

  return SQLITE_OK;
}